

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::constructorError
          (HlslParseContext *this,TSourceLoc *loc,TIntermNode *node,TFunction *function,TOperator op
          ,TType *type)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar11;
  undefined4 extraout_var_05;
  TArraySizes *this_00;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TArraySizes *pTVar12;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  size_type sVar13;
  int local_64;
  int d;
  TArraySizes *arraySizes;
  int arg;
  int iStack_48;
  bool arrayArg;
  bool matrixInMatrix;
  bool overFull;
  bool full;
  bool constType;
  int size;
  bool constructingMatrix;
  TType *type_local;
  TOperator op_local;
  TFunction *function_local;
  TIntermNode *node_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  undefined4 extraout_var_06;
  
  iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])();
  TType::shallowCopy(type,(TType *)CONCAT44(extraout_var,iVar7));
  bVar6 = false;
  if ((op - EOpConstructMat2x2 < 9) || (op - EOpConstructDMat2x2 < 0x24)) {
    bVar6 = true;
  }
  else if (op == EOpConstructTextureSampler) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unhandled texture constructor","constructor","");
    return true;
  }
  iStack_48 = 0;
  bVar2 = true;
  bVar1 = false;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  for (arraySizes._4_4_ = 0; iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(),
      (int)arraySizes._4_4_ < iVar7; arraySizes._4_4_ = arraySizes._4_4_ + 1) {
    iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)arraySizes._4_4_);
    uVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar7) + 8) + 0xe8))();
    if ((uVar10 & 1) != 0) {
      iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)arraySizes._4_4_);
      uVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar7) + 8) + 0xf8))();
      if ((uVar10 & 1) != 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"array argument must be sized","constructor","");
        return true;
      }
      bVar3 = true;
    }
    if (bVar6) {
      iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)arraySizes._4_4_);
      uVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar7) + 8) + 0xe0))();
      if ((uVar10 & 1) != 0) {
        bVar4 = true;
      }
    }
    if (bVar1) {
      bVar5 = true;
    }
    iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)arraySizes._4_4_);
    iVar7 = TType::computeNumComponents(*(TType **)(CONCAT44(extraout_var_03,iVar7) + 8));
    iStack_48 = iVar7 + iStack_48;
    if (((op != EOpConstructStruct) && (uVar8 = (*type->_vptr_TType[0x1d])(), (uVar8 & 1) == 0)) &&
       (iVar7 = TType::computeNumComponents(type), iVar7 <= iStack_48)) {
      bVar1 = true;
    }
    iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])();
    lVar11 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar7) + 8) + 0x50))();
    if (((uint)*(undefined8 *)(lVar11 + 8) & 0x7f) != 2) {
      bVar2 = false;
    }
  }
  if (bVar2) {
    iVar7 = (*type->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_05,iVar7) + 8) =
         *(ulong *)(CONCAT44(extraout_var_05,iVar7) + 8) & 0xffffffffffffff80 | 2;
  }
  uVar8 = (*type->_vptr_TType[0x1d])();
  if ((uVar8 & 1) != 0) {
    iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
    if (iVar7 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"array constructor must have at least one argument","constructor","");
      return true;
    }
    uVar8 = (*type->_vptr_TType[0x1f])();
    if ((uVar8 & 1) == 0) {
      iVar7 = (*type->_vptr_TType[0xf])();
      iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
      if ((iVar7 != iVar9) && (iVar7 = TType::computeNumComponents(type), iStack_48 < iVar7)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"array constructor needs one argument per array element","constructor",
                   "");
        return true;
      }
    }
    else {
      iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
      TType::changeOuterArraySize(type,iVar7);
    }
    bVar6 = TType::isArrayOfArrays(type);
    if (bVar6) {
      iVar7 = (*type->_vptr_TType[0x14])();
      this_00 = (TArraySizes *)CONCAT44(extraout_var_06,iVar7);
      iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
      uVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_07,iVar7) + 8) + 0xe8))();
      if ((uVar10 & 1) != 0) {
        iVar7 = TArraySizes::getNumDims(this_00);
        iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
        pTVar12 = (TArraySizes *)
                  (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar9) + 8) + 0xa0))();
        iVar9 = TArraySizes::getNumDims(pTVar12);
        if (iVar7 == iVar9 + 1) {
          bVar6 = TArraySizes::isInnerUnsized(this_00);
          if (bVar6) {
            for (local_64 = 1; iVar7 = TArraySizes::getNumDims(this_00), local_64 < iVar7;
                local_64 = local_64 + 1) {
              iVar7 = TArraySizes::getDimSize(this_00,local_64);
              if (iVar7 == 0) {
                iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
                pTVar12 = (TArraySizes *)
                          (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar7) + 8) + 0xa0))();
                iVar7 = TArraySizes::getDimSize(pTVar12,local_64 + -1);
                TArraySizes::setDimSize(this_00,local_64,iVar7);
              }
            }
          }
          goto LAB_005728af;
        }
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"array constructor argument not correct type to construct array element",
                 "constructor","");
      return true;
    }
  }
LAB_005728af:
  if (((bVar3) && (iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(), iVar7 == 1)) &&
     ((op != EOpConstructStruct &&
      ((uVar8 = (*type->_vptr_TType[0x1d])(), (uVar8 & 1) != 0 &&
       (bVar6 = TType::isArrayOfArrays(type), !bVar6)))))) {
    iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
    bVar6 = TType::isArrayOfArrays(*(TType **)(CONCAT44(extraout_var_10,iVar7) + 8));
    if ((!bVar6) && (iVar7 = (*type->_vptr_TType[0xc])(), 0 < iVar7)) {
      iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
      iVar7 = (**(code **)(**(long **)(CONCAT44(extraout_var_11,iVar7) + 8) + 0x60))();
      if (0 < iVar7) {
        return false;
      }
    }
  }
  if (((!bVar3) || (op == EOpConstructStruct)) || (bVar6 = TType::isArrayOfArrays(type), bVar6)) {
    if ((bVar4) && (uVar8 = (*type->_vptr_TType[0x1d])(), (uVar8 & 1) == 0)) {
      this_local._7_1_ = false;
    }
    else if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"too many arguments","constructor","");
      this_local._7_1_ = true;
    }
    else {
      if ((op == EOpConstructStruct) && (uVar8 = (*type->_vptr_TType[0x1d])(), (uVar8 & 1) == 0)) {
        bVar6 = isScalarConstructor(this,node);
        if (bVar6) {
          return false;
        }
        iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
        if (iVar7 == 1) {
          iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
          bVar6 = TType::operator==(type,*(TType **)(CONCAT44(extraout_var_12,iVar7) + 8));
          if (bVar6) {
            return false;
          }
        }
        this_01 = &TType::getStruct(type)->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        sVar13 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                           (this_01);
        iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
        if ((int)sVar13 != iVar7) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,
                     "Number of constructor parameters does not match the number of structure fields"
                     ,"constructor","");
          return true;
        }
      }
      if ((((op == EOpConstructStruct) || (iStack_48 == 1)) ||
          (iVar7 = TType::computeNumComponents(type), iVar7 <= iStack_48)) &&
         ((op != EOpConstructStruct ||
          (iVar7 = TType::computeNumComponents(type), iVar7 <= iStack_48)))) {
        this_local._7_1_ = false;
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"not enough data provided for construction","constructor","");
        this_local._7_1_ = true;
      }
    }
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"constructing non-array constituent from array argument","constructor","");
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslParseContext::constructorError(const TSourceLoc& loc, TIntermNode* node, TFunction& function,
                                        TOperator op, TType& type)
{
    type.shallowCopy(function.getType());

    bool constructingMatrix = false;
    switch (op) {
    case EOpConstructTextureSampler:
        error(loc, "unhandled texture constructor", "constructor", "");
        return true;
    case EOpConstructMat2x2:
    case EOpConstructMat2x3:
    case EOpConstructMat2x4:
    case EOpConstructMat3x2:
    case EOpConstructMat3x3:
    case EOpConstructMat3x4:
    case EOpConstructMat4x2:
    case EOpConstructMat4x3:
    case EOpConstructMat4x4:
    case EOpConstructDMat2x2:
    case EOpConstructDMat2x3:
    case EOpConstructDMat2x4:
    case EOpConstructDMat3x2:
    case EOpConstructDMat3x3:
    case EOpConstructDMat3x4:
    case EOpConstructDMat4x2:
    case EOpConstructDMat4x3:
    case EOpConstructDMat4x4:
    case EOpConstructIMat2x2:
    case EOpConstructIMat2x3:
    case EOpConstructIMat2x4:
    case EOpConstructIMat3x2:
    case EOpConstructIMat3x3:
    case EOpConstructIMat3x4:
    case EOpConstructIMat4x2:
    case EOpConstructIMat4x3:
    case EOpConstructIMat4x4:
    case EOpConstructUMat2x2:
    case EOpConstructUMat2x3:
    case EOpConstructUMat2x4:
    case EOpConstructUMat3x2:
    case EOpConstructUMat3x3:
    case EOpConstructUMat3x4:
    case EOpConstructUMat4x2:
    case EOpConstructUMat4x3:
    case EOpConstructUMat4x4:
    case EOpConstructBMat2x2:
    case EOpConstructBMat2x3:
    case EOpConstructBMat2x4:
    case EOpConstructBMat3x2:
    case EOpConstructBMat3x3:
    case EOpConstructBMat3x4:
    case EOpConstructBMat4x2:
    case EOpConstructBMat4x3:
    case EOpConstructBMat4x4:
        constructingMatrix = true;
        break;
    default:
        break;
    }

    //
    // Walk the arguments for first-pass checks and collection of information.
    //

    int size = 0;
    bool constType = true;
    bool full = false;
    bool overFull = false;
    bool matrixInMatrix = false;
    bool arrayArg = false;
    for (int arg = 0; arg < function.getParamCount(); ++arg) {
        if (function[arg].type->isArray()) {
            if (function[arg].type->isUnsizedArray()) {
                // Can't construct from an unsized array.
                error(loc, "array argument must be sized", "constructor", "");
                return true;
            }
            arrayArg = true;
        }
        if (constructingMatrix && function[arg].type->isMatrix())
            matrixInMatrix = true;

        // 'full' will go to true when enough args have been seen.  If we loop
        // again, there is an extra argument.
        if (full) {
            // For vectors and matrices, it's okay to have too many components
            // available, but not okay to have unused arguments.
            overFull = true;
        }

        size += function[arg].type->computeNumComponents();
        if (op != EOpConstructStruct && ! type.isArray() && size >= type.computeNumComponents())
            full = true;

        if (function[arg].type->getQualifier().storage != EvqConst)
            constType = false;
    }

    if (constType)
        type.getQualifier().storage = EvqConst;

    if (type.isArray()) {
        if (function.getParamCount() == 0) {
            error(loc, "array constructor must have at least one argument", "constructor", "");
            return true;
        }

        if (type.isUnsizedArray()) {
            // auto adapt the constructor type to the number of arguments
            type.changeOuterArraySize(function.getParamCount());
        } else if (type.getOuterArraySize() != function.getParamCount() && type.computeNumComponents() > size) {
            error(loc, "array constructor needs one argument per array element", "constructor", "");
            return true;
        }

        if (type.isArrayOfArrays()) {
            // Types have to match, but we're still making the type.
            // Finish making the type, and the comparison is done later
            // when checking for conversion.
            TArraySizes& arraySizes = *type.getArraySizes();

            // At least the dimensionalities have to match.
            if (! function[0].type->isArray() ||
                arraySizes.getNumDims() != function[0].type->getArraySizes()->getNumDims() + 1) {
                error(loc, "array constructor argument not correct type to construct array element", "constructor", "");
                return true;
            }

            if (arraySizes.isInnerUnsized()) {
                // "Arrays of arrays ..., and the size for any dimension is optional"
                // That means we need to adopt (from the first argument) the other array sizes into the type.
                for (int d = 1; d < arraySizes.getNumDims(); ++d) {
                    if (arraySizes.getDimSize(d) == UnsizedArraySize) {
                        arraySizes.setDimSize(d, function[0].type->getArraySizes()->getDimSize(d - 1));
                    }
                }
            }
        }
    }

    // Some array -> array type casts are okay
    if (arrayArg && function.getParamCount() == 1 && op != EOpConstructStruct && type.isArray() &&
        !type.isArrayOfArrays() && !function[0].type->isArrayOfArrays() &&
        type.getVectorSize() >= 1 && function[0].type->getVectorSize() >= 1)
        return false;

    if (arrayArg && op != EOpConstructStruct && ! type.isArrayOfArrays()) {
        error(loc, "constructing non-array constituent from array argument", "constructor", "");
        return true;
    }

    if (matrixInMatrix && ! type.isArray()) {
        return false;
    }

    if (overFull) {
        error(loc, "too many arguments", "constructor", "");
        return true;
    }

    if (op == EOpConstructStruct && ! type.isArray()) {
        if (isScalarConstructor(node))
            return false;

        // Self-type construction: e.g, we can construct a struct from a single identically typed object.
        if (function.getParamCount() == 1 && type == *function[0].type)
            return false;

        if ((int)type.getStruct()->size() != function.getParamCount()) {
            error(loc, "Number of constructor parameters does not match the number of structure fields", "constructor", "");
            return true;
        }
    }

    if ((op != EOpConstructStruct && size != 1 && size < type.computeNumComponents()) ||
        (op == EOpConstructStruct && size < type.computeNumComponents())) {
        error(loc, "not enough data provided for construction", "constructor", "");
        return true;
    }

    return false;
}